

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderMultisampleInterpolationStateQueryTests::init
          (ShaderMultisampleInterpolationStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  TestNode *pTVar2;
  InterpolationOffsetCase *pIVar3;
  undefined8 extraout_RAX;
  undefined8 uVar4;
  TestCase *this_00;
  undefined8 extraout_RAX_00;
  long lVar5;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "min_fragment_interpolation_offset","Test MIN_FRAGMENT_INTERPOLATION_OFFSET");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (lVar5 = 0x10; lVar5 != 0x70; lVar5 = lVar5 + 0x18) {
    pIVar3 = (InterpolationOffsetCase *)operator_new(0x80);
    anon_unknown_1::InterpolationOffsetCase::InterpolationOffsetCase
              (pIVar3,(this->super_TestCaseGroup).m_context,*(char **)(&UNK_00a0cf18 + lVar5),
               *(char **)((long)&init::verifiers[0].verifier + lVar5),
               *(QueryType *)((long)&PTR_iterate_00a0cf10 + lVar5),TEST_MIN_OFFSET);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "max_fragment_interpolation_offset","Test MAX_FRAGMENT_INTERPOLATION_OFFSET");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (lVar5 = 0x10; lVar5 != 0x70; lVar5 = lVar5 + 0x18) {
    pIVar3 = (InterpolationOffsetCase *)operator_new(0x80);
    anon_unknown_1::InterpolationOffsetCase::InterpolationOffsetCase
              (pIVar3,(this->super_TestCaseGroup).m_context,*(char **)(&UNK_00a0cf18 + lVar5),
               *(char **)((long)&init::verifiers[0].verifier + lVar5),
               *(QueryType *)((long)&PTR_iterate_00a0cf10 + lVar5),TEST_MAX_OFFSET);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "fragment_interpolation_offset_bits","Test FRAGMENT_INTERPOLATION_OFFSET_BITS");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  uVar4 = extraout_RAX;
  for (lVar5 = 0x10; lVar5 != 0x70; lVar5 = lVar5 + 0x18) {
    this_00 = (TestCase *)operator_new(0x80);
    uVar1 = *(undefined4 *)((long)&PTR_iterate_00a0cf10 + lVar5);
    TestCase::TestCase(this_00,(this->super_TestCaseGroup).m_context,
                       *(char **)(&UNK_00a0cf18 + lVar5),
                       *(char **)((long)&init::verifiers[0].verifier + lVar5));
    (this_00->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a0cff8;
    *(undefined4 *)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
    uVar4 = extraout_RAX_00;
  }
  return (int)uVar4;
}

Assistant:

void ShaderMultisampleInterpolationStateQueryTests::init (void)
{
	static const struct Verifier
	{
		QueryType		verifier;
		const char*		name;
		const char*		desc;
	} verifiers[] =
	{
		{ QUERY_BOOLEAN,	"get_boolean",		"Test using getBoolean"		},
		{ QUERY_INTEGER,	"get_integer",		"Test using getInteger"		},
		{ QUERY_FLOAT,		"get_float",		"Test using getFloat"		},
		{ QUERY_INTEGER64,	"get_integer64",	"Test using getInteger64"	},
	};

	// .min_fragment_interpolation_offset
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "min_fragment_interpolation_offset", "Test MIN_FRAGMENT_INTERPOLATION_OFFSET");
		addChild(group);

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
			group->addChild(new InterpolationOffsetCase(m_context, verifiers[verifierNdx].name, verifiers[verifierNdx].desc, verifiers[verifierNdx].verifier, InterpolationOffsetCase::TEST_MIN_OFFSET));
	}

	// .max_fragment_interpolation_offset
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "max_fragment_interpolation_offset", "Test MAX_FRAGMENT_INTERPOLATION_OFFSET");
		addChild(group);

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
			group->addChild(new InterpolationOffsetCase(m_context, verifiers[verifierNdx].name, verifiers[verifierNdx].desc, verifiers[verifierNdx].verifier, InterpolationOffsetCase::TEST_MAX_OFFSET));
	}

	// .fragment_interpolation_offset_bits
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "fragment_interpolation_offset_bits", "Test FRAGMENT_INTERPOLATION_OFFSET_BITS");
		addChild(group);

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
			group->addChild(new FragmentInterpolationOffsetBitsCase(m_context, verifiers[verifierNdx].name, verifiers[verifierNdx].desc, verifiers[verifierNdx].verifier));
	}
}